

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O1

int Fraig_NodeIsExorType(Fraig_Node_t *pNode)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  Fraig_Node_t *p;
  uint uVar5;
  
  p = (Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe);
  iVar1 = Fraig_NodeIsAnd(p);
  uVar4 = 0;
  uVar5 = 0;
  if (iVar1 != 0) {
    iVar1 = Fraig_NodeIsAnd(p->p1);
    if ((iVar1 != 0) && (((ulong)p->p1 & 1) != 0)) {
      iVar1 = Fraig_NodeIsAnd(p->p2);
      uVar4 = uVar5;
      if ((iVar1 != 0) && (((ulong)p->p2 & 1) != 0)) {
        piVar3 = (int *)((ulong)p->p1 & 0xfffffffffffffffe);
        piVar2 = (int *)((ulong)p->p2 & 0xfffffffffffffffe);
        if (*piVar2 <= *piVar3) {
          __assert_fail("pNode1->Num < pNode2->Num",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigUtil.c"
                        ,0x23e,"int Fraig_NodeIsExorType(Fraig_Node_t *)");
        }
        if (*(ulong *)(piVar3 + 8) == (*(ulong *)(piVar2 + 8) ^ 1)) {
          uVar4 = (uint)(*(ulong *)(piVar3 + 10) == (*(ulong *)(piVar2 + 10) ^ 1));
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int Fraig_NodeIsExorType( Fraig_Node_t * pNode )
{
    Fraig_Node_t * pNode1, * pNode2;
    // make the node regular (it does not matter for EXOR/NEXOR)
    pNode = Fraig_Regular(pNode);
    // if the node or its children are not ANDs or not compl, this cannot be EXOR type
    if ( !Fraig_NodeIsAnd(pNode) )
        return 0;
    if ( !Fraig_NodeIsAnd(pNode->p1) || !Fraig_IsComplement(pNode->p1) )
        return 0;
    if ( !Fraig_NodeIsAnd(pNode->p2) || !Fraig_IsComplement(pNode->p2) )
        return 0;

    // get children
    pNode1 = Fraig_Regular(pNode->p1);
    pNode2 = Fraig_Regular(pNode->p2);
    assert( pNode1->Num < pNode2->Num );

    // compare grandchildren
    return pNode1->p1 == Fraig_Not(pNode2->p1) && pNode1->p2 == Fraig_Not(pNode2->p2);
}